

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O1

Node * __thiscall Parser::parseConstStatement(Parser *this,Token *const_token,bool is_global)

{
  NodeType NVar1;
  pointer ppNVar2;
  Node *pNVar3;
  Node *name;
  Node *value;
  Node *pNVar4;
  
  expect(this,TK_IDENTIFIER);
  name = createIdentifierNode(this,this->tok);
  expect(this,TK_ASSIGN);
  value = parseTernaryOp(this);
  pNVar4 = value;
  if (((value->nodeType == PNT_UNARY_PRE_OP) && (value->tok->type == TK_MINUS)) &&
     (ppNVar2 = (value->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start,
     (long)(value->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish - (long)ppNVar2 == 8)) {
    pNVar3 = *ppNVar2;
    NVar1 = pNVar3->nodeType;
    if ((NVar1 == PNT_FLOAT) || (NVar1 == PNT_INTEGER)) {
      pNVar4 = pNVar3;
    }
  }
  if ((pNVar4 != (Node *)0x0) && (3 < pNVar4->nodeType - PNT_INTEGER)) {
    CompilationContext::error
              (this->ctx,0x82,"expected scalar (boolean, integer, float, string)",pNVar4->tok->line,
               (uint)pNVar4->tok->column);
  }
  pNVar4 = createConstDeclarationNode(this,const_token,name,value,is_global);
  return pNVar4;
}

Assistant:

Node * parseConstStatement(Token * const_token, bool is_global)
  {
    expect(TK_IDENTIFIER);
    Node * name = createIdentifierNode(*tok);
    expect(TK_ASSIGN);
    Node * value = parseTernaryOp();

#define ACCEPT_ONLY_SCALAR_CONST 1
#if (ACCEPT_ONLY_SCALAR_CONST)
    Node * check = value;
    if (check->nodeType == PNT_UNARY_PRE_OP && check->tok.type == TK_MINUS && check->children.size() == 1 &&
      (check->children[0]->nodeType == PNT_FLOAT || check->children[0]->nodeType == PNT_INTEGER))
    {
      check = value->children[0];
    }

    if (check && check->nodeType != PNT_INTEGER && check->nodeType != PNT_BOOL && check->nodeType != PNT_FLOAT &&
      check->nodeType != PNT_STRING)
    {
      ctx.error(130, "expected scalar (boolean, integer, float, string)", check->tok.line, check->tok.column);
    }

#endif

    return createConstDeclarationNode(*const_token, name, value, is_global);
  }